

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

void vkt::api::anon_unknown_0::addBlittingImageAllFormatsColorSrcFormatDstFormatTests
               (TestCaseGroup *group,BlitColorTestParams *testParams)

{
  TestContext *testCtx;
  BlittingTestCase *pBVar1;
  long lVar2;
  long lVar3;
  VkImageLayout layout;
  VkImageLayout layout_00;
  VkImageLayout layout_01;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  string testName;
  string description;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  TestParams local_d0;
  TestParams local_80;
  
  testCtx = (group->super_TestNode).m_testCtx;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    (testParams->params).src.image.operationLayout = (&DAT_0094c038)[lVar2];
    lVar3 = 0;
    while( true ) {
      if (lVar3 == 8) break;
      (testParams->params).dst.image.operationLayout =
           *(VkImageLayout *)((long)&DAT_0094c040 + lVar3);
      (testParams->params).field_3.filter = VK_FILTER_NEAREST;
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_190,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).src.image.operationLayout,
                 (VkImageLayout)in_RDX);
      std::operator+(&local_110,&local_190,"_");
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_150,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).dst.image.operationLayout,
                 layout);
      std::operator+(&local_170,&local_110,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_190);
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_130,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).src.image.operationLayout,
                 layout_00);
      std::operator+(&local_150,"Blit from layout ",&local_130);
      std::operator+(&local_190,&local_150," to ");
      api::(anonymous_namespace)::getImageLayoutCaseName_abi_cxx11_
                (&local_f0,
                 (_anonymous_namespace_ *)(ulong)(testParams->params).dst.image.operationLayout,
                 layout_01);
      std::operator+(&local_110,&local_190,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      pBVar1 = (BlittingTestCase *)operator_new(0xc0);
      std::operator+(&local_190,&local_170,"_nearest");
      TestParams::TestParams(&local_80,&testParams->params);
      BlittingTestCase::BlittingTestCase(pBVar1,testCtx,&local_190,&local_110,&local_80);
      tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)pBVar1);
      TestParams::~TestParams(&local_80);
      std::__cxx11::string::~string((string *)&local_190);
      if (testParams->onlyNearest == false) {
        (testParams->params).field_3.filter = VK_FILTER_LINEAR;
        pBVar1 = (BlittingTestCase *)operator_new(0xc0);
        std::operator+(&local_190,&local_170,"_linear");
        TestParams::TestParams(&local_d0,&testParams->params);
        BlittingTestCase::BlittingTestCase(pBVar1,testCtx,&local_190,&local_110,&local_d0);
        tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)pBVar1);
        TestParams::~TestParams(&local_d0);
        std::__cxx11::string::~string((string *)&local_190);
      }
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_170);
      lVar3 = lVar3 + 4;
      in_RDX = extraout_RDX;
    }
  }
  return;
}

Assistant:

void addBlittingImageAllFormatsColorSrcFormatDstFormatTests (tcu::TestCaseGroup* group, BlitColorTestParams testParams)
{
	tcu::TestContext& testCtx				= group->getTestContext();

	const VkImageLayout blitSrcLayouts[]	=
	{
		VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};
	const VkImageLayout blitDstLayouts[]	=
	{
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		VK_IMAGE_LAYOUT_GENERAL
	};

	for (int srcLayoutNdx = 0u; srcLayoutNdx < DE_LENGTH_OF_ARRAY(blitSrcLayouts); ++srcLayoutNdx)
	{
		testParams.params.src.image.operationLayout = blitSrcLayouts[srcLayoutNdx];
		for (int dstLayoutNdx = 0u; dstLayoutNdx < DE_LENGTH_OF_ARRAY(blitDstLayouts); ++dstLayoutNdx)
		{
			testParams.params.dst.image.operationLayout = blitDstLayouts[dstLayoutNdx];

			testParams.params.filter			= VK_FILTER_NEAREST;
			const std::string testName			= getImageLayoutCaseName(testParams.params.src.image.operationLayout) + "_" +
												  getImageLayoutCaseName(testParams.params.dst.image.operationLayout);
			const std::string description		= "Blit from layout " + getImageLayoutCaseName(testParams.params.src.image.operationLayout) +
												  " to " + getImageLayoutCaseName(testParams.params.dst.image.operationLayout);
			group->addChild(new BlittingTestCase(testCtx, testName + "_nearest", description, testParams.params));

			if (!testParams.onlyNearest)
			{
				testParams.params.filter		= VK_FILTER_LINEAR;
				group->addChild(new BlittingTestCase(testCtx, testName + "_linear", description, testParams.params));
			}
		}
	}
}